

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O3

bool benchmark::walltime::anon_unknown_1::UseCpuCycleClock(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  
  bVar1 = CpuScalingEnabled();
  iVar2 = internal::GetLogLevel();
  if (bVar1) {
    if (iVar2 < 1) {
      poVar3 = internal::GetNullLogInstance();
    }
    else {
      poVar3 = internal::GetErrorLogInstance();
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-- LOG(",7);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): ",3);
    pcVar5 = "Using std::chrono to provide walltime::Now().\n";
    lVar4 = 0x2e;
  }
  else {
    if (iVar2 < 1) {
      poVar3 = internal::GetNullLogInstance();
    }
    else {
      poVar3 = internal::GetErrorLogInstance();
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-- LOG(",7);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): ",3);
    pcVar5 = "Using the CPU cycle clock to provide walltime::Now().\n";
    lVar4 = 0x36;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  return !bVar1;
}

Assistant:

bool UseCpuCycleClock() {
    bool useWallTime = !CpuScalingEnabled();
    if (useWallTime) {
        VLOG(1) << "Using the CPU cycle clock to provide walltime::Now().\n";
    } else {
        VLOG(1) << "Using std::chrono to provide walltime::Now().\n";
    }
    return useWallTime;
}